

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void poison_tick(CHAR_DATA *ch,AFFECT_DATA *af)

{
  bool bVar1;
  CHAR_DATA *ch_00;
  
  bVar1 = is_affected_by(ch,0xc);
  if (bVar1) {
    act("$n shivers and suffers.",ch,(void *)0x0,(void *)0x0,0);
    send_to_char("You shiver and suffer.\n\r",ch);
    ch_00 = af->owner;
    if (af->owner == (CHAR_DATA *)0x0) {
      af->owner = ch;
      ch_00 = ch;
    }
    damage_new(ch_00,ch,(int)af->level,(int)gsn_poison,8,true,false,0,1,"poison");
  }
  return;
}

Assistant:

void poison_tick(CHAR_DATA *ch, AFFECT_DATA *af)
{
	if (!is_affected_by(ch, AFF_POISON))
		return;

	act("$n shivers and suffers.", ch, nullptr, nullptr, TO_ROOM);
	send_to_char("You shiver and suffer.\n\r", ch);

	if (!af->owner)
		af->owner = ch;

	damage_new(af->owner, ch, af->level, gsn_poison, DAM_POISON, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "poison");
}